

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  uint uVar1;
  int iVar2;
  decoder_tables *this_00;
  uint uVar3;
  EVP_PKEY_CTX *pEVar4;
  
  uVar1 = (this->m_code_sizes).m_size;
  this->m_total_syms = uVar1;
  this_00 = this->m_pDecode_tables;
  if (this_00 == (decoder_tables *)0x0) {
    this_00 = (decoder_tables *)crnd_malloc(0xc0,(size_t *)0x0);
    if (this_00 != (decoder_tables *)0x0) {
      this_00->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&this_00->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&this_00->m_lookup + 4) = 0;
    }
    this->m_pDecode_tables = this_00;
    uVar1 = this->m_total_syms;
  }
  pEVar4 = (EVP_PKEY_CTX *)(ulong)uVar1;
  if (0x10 < uVar1) {
    do {
      uVar3 = (uint)pEVar4;
      pEVar4 = (EVP_PKEY_CTX *)((ulong)pEVar4 >> 1);
    } while (3 < uVar3);
  }
  iVar2 = prefix_coding::decoder_tables::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
  return SUB41(iVar2,0);
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint32 total_syms = m_code_sizes.size();

        CRND_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_total_syms = total_syms;

        if (!m_pDecode_tables)
            m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>();

        return m_pDecode_tables->init(m_total_syms, &m_code_sizes[0], compute_decoder_table_bits());
    }